

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

LogicalType *
duckdb::EnumTypeInfo::CreateType
          (LogicalType *__return_storage_ptr__,Vector *ordered_data,idx_t size)

{
  PhysicalType PVar1;
  InternalException *this;
  allocator local_61;
  idx_t size_local;
  shared_ptr<duckdb::ExtraTypeInfo,_true> info;
  undefined1 local_48 [32];
  __shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  size_local = size;
  PVar1 = DictType(size);
  if (PVar1 == UINT8) {
    make_shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,duckdb::Vector&,unsigned_long&>
              ((Vector *)local_48,(unsigned_long *)ordered_data);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::
    operator=<duckdb::EnumTypeInfoTemplated<unsigned_char>,_0>
              (&info,(shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_true> *)local_48);
  }
  else if (PVar1 == UINT16) {
    make_shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_short>,duckdb::Vector&,unsigned_long&>
              ((Vector *)local_48,(unsigned_long *)ordered_data);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::
    operator=<duckdb::EnumTypeInfoTemplated<unsigned_short>,_0>
              (&info,(shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_short>,_true> *)local_48);
  }
  else {
    if (PVar1 != UINT32) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)local_48,"Invalid Physical Type for ENUMs",&local_61)
      ;
      InternalException::InternalException(this,(string *)local_48);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,duckdb::Vector&,unsigned_long&>
              ((Vector *)local_48,(unsigned_long *)ordered_data);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::
    operator=<duckdb::EnumTypeInfoTemplated<unsigned_int>,_0>
              (&info,(shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true> *)local_48);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  ::std::__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_28,(__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)&info);
  LogicalType::LogicalType
            (__return_storage_ptr__,ENUM,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

LogicalType EnumTypeInfo::CreateType(Vector &ordered_data, idx_t size) {
	// Generate EnumTypeInfo
	shared_ptr<ExtraTypeInfo> info;
	auto enum_internal_type = EnumTypeInfo::DictType(size);
	switch (enum_internal_type) {
	case PhysicalType::UINT8:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint8_t>>(ordered_data, size);
		break;
	case PhysicalType::UINT16:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint16_t>>(ordered_data, size);
		break;
	case PhysicalType::UINT32:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint32_t>>(ordered_data, size);
		break;
	default:
		throw InternalException("Invalid Physical Type for ENUMs");
	}
	// Generate Actual Enum Type
	return LogicalType(LogicalTypeId::ENUM, info);
}